

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_multi_var
              (secp256k1_ecmult_context *ctx,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  ushort uVar1;
  uint64_t *na;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  code *pcVar6;
  uint64_t *rzr;
  secp256k1_fe *rzr_00;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong local_1e8;
  secp256k1_ge point;
  secp256k1_gej pointj;
  secp256k1_gej tmpj;
  secp256k1_scalar local_78;
  uint64_t local_50 [4];
  
  secp256k1_gej_set_infinity(r);
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n != 0) {
    if (n == 0) {
      tmpj.x.n[2] = 0;
      tmpj.x.n[3] = 0;
      tmpj.x.n[0] = 0;
      tmpj.x.n[1] = 0;
      secp256k1_ecmult(ctx,r,r,(secp256k1_scalar *)&tmpj,inp_g_sc);
    }
    else if (scratch == (secp256k1_scratch *)0x0) {
      local_78.d[0] = 0;
      local_78.d[1] = 0;
      local_78.d[2] = 0;
      local_78.d[3] = 0;
      secp256k1_gej_set_infinity(r);
      secp256k1_ecmult(ctx,r,&tmpj,&local_78,inp_g_sc);
      na = (&local_78)[1].d + 1;
      for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
        iVar2 = (*cb)((secp256k1_scalar *)na,&point,sVar3,cbdata);
        if (iVar2 == 0) {
          return 0;
        }
        pointj.infinity = point.infinity;
        pointj.x.n[4] = point.x.n[4];
        pointj.x.n[2] = point.x.n[2];
        pointj.x.n[3] = point.x.n[3];
        pointj.x.n[0] = point.x.n[0];
        pointj.x.n[1] = point.x.n[1];
        pointj.y.n[0] = point.y.n[0];
        pointj.y.n[1] = point.y.n[1];
        pointj.y.n[4] = point.y.n[4];
        pointj.y.n[2] = point.y.n[2];
        pointj.y.n[3] = point.y.n[3];
        pointj.z.n[0] = 1;
        pointj.z.n[3] = 0;
        pointj.z.n[4] = 0;
        pointj.z.n[1] = 0;
        pointj.z.n[2] = 0;
        rzr = na;
        secp256k1_ecmult(ctx,&tmpj,&pointj,(secp256k1_scalar *)na,(secp256k1_scalar *)0x0);
        secp256k1_gej_add_var(r,r,&tmpj,(secp256k1_fe *)rzr);
      }
    }
    else {
      sVar3 = secp256k1_scratch_max_allocation(scratch,6);
      uVar5 = 1;
      uVar9 = 0;
      do {
        iVar2 = (int)uVar5;
        uVar7 = uVar5;
        switch(iVar2) {
        case 1:
          break;
        case 2:
          uVar7 = 0xb;
          break;
        case 3:
          uVar7 = 0x2d;
          break;
        case 4:
          uVar7 = 100;
          break;
        case 5:
          uVar7 = 0x113;
          break;
        case 6:
          uVar7 = 0x271;
          break;
        case 7:
          uVar7 = 0x73a;
          break;
        case 8:
          uVar7 = 0xd48;
          break;
        case 9:
          uVar7 = 0x259e;
          break;
        case 10:
          uVar7 = 0x45ec;
          break;
        case 0xb:
          uVar7 = 0x8020;
          break;
        case 0xc:
          uVar7 = 0xffffffffffffffff;
          break;
        case 0xd:
          goto switchD_00111d9c_caseD_d;
        default:
          uVar7 = 0;
        }
        uVar1 = (short)((iVar2 + 0x100U & 0xffff) / (iVar2 + 1U & 0xffff)) * 4 + 0x8c;
        uVar5 = (ulong)((0x80 << ((byte)uVar5 & 0x1f)) + (uint)uVar1 + 0x10);
        if (sVar3 < uVar5) break;
        uVar4 = (sVar3 - uVar5) / (ulong)uVar1;
        uVar5 = uVar7;
        if (uVar4 < uVar7) {
          uVar5 = uVar4;
        }
        if (uVar9 < uVar5) {
          uVar9 = uVar5;
        }
        uVar5 = (ulong)(iVar2 + 1);
      } while (uVar7 <= uVar4);
switchD_00111d9c_caseD_d:
      if (uVar9 == 0) {
        return 0;
      }
      local_1e8 = 10000000;
      if (uVar9 < 10000000) {
        local_1e8 = uVar9;
      }
      local_1e8 = ((local_1e8 + n) - 1) / local_1e8;
      uVar5 = ((local_1e8 + n) - 1) / local_1e8;
      if (uVar5 < 0xa0) {
        if (sVar3 < 0xcb0) {
          return 0;
        }
        local_1e8 = (sVar3 / 0xcb0 + (n - 1)) / (sVar3 / 0xcb0);
        uVar5 = ((n - 1) + local_1e8) / local_1e8;
        pcVar6 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar6 = secp256k1_ecmult_pippenger_batch;
      }
      lVar8 = 0;
      for (uVar9 = 0; local_1e8 != uVar9; uVar9 = uVar9 + 1) {
        uVar7 = uVar5;
        if (n < uVar5) {
          uVar7 = n;
        }
        rzr_00 = (secp256k1_fe *)0x0;
        if (uVar9 == 0) {
          rzr_00 = (secp256k1_fe *)inp_g_sc;
        }
        iVar2 = (*pcVar6)(ctx,scratch,&tmpj,rzr_00,cb,cbdata,uVar7,lVar8);
        if (iVar2 == 0) {
          return 0;
        }
        secp256k1_gej_add_var(r,r,&tmpj,rzr_00);
        n = n - uVar7;
        lVar8 = lVar8 + uVar5;
      }
    }
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_ecmult_context *ctx, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_ecmult_context*, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t max_points;
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_scalar szero;
        secp256k1_scalar_set_int(&szero, 0);
        secp256k1_ecmult(ctx, r, r, &szero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_var_simple(ctx, r, inp_g_sc, cb, cbdata, n);
    }

    max_points = secp256k1_pippenger_max_points(scratch);
    if (max_points == 0) {
        return 0;
    } else if (max_points > ECMULT_MAX_POINTS_PER_BATCH) {
        max_points = ECMULT_MAX_POINTS_PER_BATCH;
    }
    n_batches = (n+max_points-1)/max_points;
    n_batch_points = (n+n_batches-1)/n_batches;

    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        max_points = secp256k1_strauss_max_points(scratch);
        if (max_points == 0) {
            return 0;
        }
        n_batches = (n+max_points-1)/max_points;
        n_batch_points = (n+n_batches-1)/n_batches;
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(ctx, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}